

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<double> *this;
  bool bVar1;
  time_t tVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  iterator iVar7;
  iterator iVar8;
  double dVar9;
  size_type sVar10;
  reference pvVar11;
  reference puVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  string local_a90;
  allocator local_a69;
  string local_a68;
  string local_a48;
  allocator local_a21;
  string local_a20;
  string local_a00;
  allocator local_9d9;
  string local_9d8;
  string local_9b8;
  allocator local_991;
  string local_990;
  string local_970;
  allocator local_949;
  string local_948;
  string local_928;
  allocator local_901;
  string local_900;
  string local_8e0;
  allocator local_8b9;
  string local_8b8;
  double local_898;
  double delta;
  undefined1 local_888 [4];
  int mode;
  TAlg tAlg;
  TResult tRes;
  iterator iStack_628;
  uint re_1;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> res_1;
  Timer EvalTimer_1;
  iterator iStack_5d0;
  uint re;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> res;
  Timer EvalTimer;
  double real_budget;
  size_t i_1;
  uniform_int_distribution<unsigned_int> u;
  default_random_engine engine;
  value_type_conflict4 local_558;
  undefined1 local_550 [8];
  vector<double,_std::allocator<double>_> budget_list;
  ulong local_520;
  size_t i;
  size_t count_degree;
  undefined1 local_4f0 [8];
  ofstream outputFile;
  allocator<unsigned_long> local_2e9;
  value_type_conflict2 local_2e8;
  undefined1 local_2e0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> vec_degree;
  string local_2a8;
  undefined1 local_288 [8];
  Graph resgraph;
  string local_250;
  undefined1 local_230 [8];
  Graph graph;
  Timer mainTimer;
  string local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [8];
  string infilename;
  TArgument Arg;
  char **argv_local;
  int argc_local;
  
  Arg._outFileName.field_2._8_8_ = argv;
  tVar2 = time((time_t *)0x0);
  dsfmt_chk_init_gen_rand(&dsfmt_global_data,(uint32_t)tVar2,0x4de1);
  Argument::Argument((Argument *)((long)&infilename.field_2 + 8),argc,
                     (char **)Arg._outFileName.field_2._8_8_);
  std::operator+(&local_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&Arg._mode.field_2 + 8),"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                 &local_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&Arg._model);
  std::__cxx11::string::~string((string *)&local_1a0);
  if ((infilename.field_2._8_4_ == 0) || (infilename.field_2._8_4_ == 2)) {
    std::__cxx11::string::string((string *)&local_1d0,(string *)local_180);
    std::__cxx11::string::string
              ((string *)&local_1f0,(string *)(Arg._graphname.field_2._M_local_buf + 8));
    GraphBase::format_graph(&local_1d0,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1d0);
    if (infilename.field_2._8_4_ == 0) {
      argv_local._4_4_ = 1;
      goto LAB_0011b16b;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"---The Begin of ");
  poVar3 = std::operator<<(poVar3,(string *)(Arg._probDist.field_2._M_local_buf + 8));
  std::operator<<(poVar3,"---\n");
  Timer::Timer((Timer *)&graph.
                         super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,"main");
  poVar3 = std::operator<<((ostream *)&std::cout,"Format Graph Successfully");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string((string *)&local_250,(string *)local_180);
  std::__cxx11::string::string
            ((string *)
             &resgraph.
              super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (string *)(Arg._algName.field_2._M_local_buf + 8));
  GraphBase::load_graph
            ((Graph *)local_230,&local_250,false,
             (string *)
             &resgraph.
              super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(float)Arg._samplesize);
  std::__cxx11::string::~string
            ((string *)
             &resgraph.
              super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string((string *)&local_2a8,(string *)local_180);
  std::__cxx11::string::string
            ((string *)
             &vec_degree.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (string *)(Arg._algName.field_2._M_local_buf + 8));
  GraphBase::load_graph
            ((Graph *)local_288,&local_2a8,true,
             (string *)
             &vec_degree.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(float)Arg._samplesize);
  std::__cxx11::string::~string
            ((string *)
             &vec_degree.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_2a8);
  poVar3 = std::operator<<((ostream *)&std::cout,"Load Graph Successfully");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  sVar4 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  *)local_230);
  local_2e8 = 0;
  std::allocator<unsigned_long>::allocator(&local_2e9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e0,sVar4,&local_2e8,
             &local_2e9);
  std::allocator<unsigned_long>::~allocator(&local_2e9);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&count_degree,
                 "degree_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&Arg._model);
  std::ofstream::ofstream(local_4f0,(string *)&count_degree,_S_out);
  std::__cxx11::string::~string((string *)&count_degree);
  i = 0;
  for (local_520 = 0;
      sVar4 = std::
              vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
              ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                      *)local_230), local_520 < sVar4; local_520 = local_520 + 1) {
    pvVar5 = std::
             vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             ::operator[]((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                           *)local_230,local_520);
    sVar4 = std::
            vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ::size(pvVar5);
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e0,local_520
                       );
    *pvVar6 = sVar4;
    pvVar5 = std::
             vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             ::operator[]((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                           *)local_230,local_520);
    sVar4 = std::
            vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ::size(pvVar5);
    i = i + sVar4;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"# Node: ");
  sVar4 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  *)local_230);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"# Edge: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,i);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Ave degree: ");
  auVar14._8_4_ = (int)(i >> 0x20);
  auVar14._0_8_ = i;
  auVar14._12_4_ = 0x45300000;
  sVar4 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  *)local_230);
  auVar28._8_4_ = (int)(sVar4 >> 0x20);
  auVar28._0_8_ = sVar4;
  auVar28._12_4_ = 0x45300000;
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,((auVar14._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0)) /
                             ((auVar28._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)));
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  iVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e0);
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e0);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,main::__0>
            (iVar7._M_current,iVar8._M_current);
  sVar4 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  *)local_230);
  local_558 = 0.0;
  this = (allocator<double> *)((long)&engine._M_x + 7);
  std::allocator<double>::allocator(this);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_550,sVar4,&local_558,this);
  std::allocator<double>::~allocator((allocator<double> *)((long)&engine._M_x + 7));
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&u);
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_int> *)&i_1,5,10);
  for (real_budget = 0.0;
      dVar9 = (double)std::
                      vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                      ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                              *)local_230), dVar13 = Arg._delta, (ulong)real_budget < (ulong)dVar9;
      real_budget = (double)((long)real_budget + 1)) {
    pvVar5 = std::
             vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             ::operator[]((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                           *)local_230,(size_type)real_budget);
    sVar4 = std::
            vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ::size(pvVar5);
    dVar13 = Arg._delta;
    sVar10 = std::
             vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                     *)local_230);
    auVar29._8_4_ = (int)(sVar10 >> 0x20);
    auVar29._0_8_ = sVar10;
    auVar29._12_4_ = 0x45300000;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e0,
                        (long)(int)(dVar13 * ((auVar29._8_8_ - 1.9342813113834067e+25) +
                                             ((double)CONCAT44(0x43300000,(int)sVar10) -
                                             4503599627370496.0))));
    if (*pvVar6 < sVar4) {
      pvVar5 = std::
               vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                             *)local_230,(size_type)real_budget);
      sVar4 = std::
              vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              ::size(pvVar5);
      auVar30._8_4_ = (int)(sVar4 >> 0x20);
      auVar30._0_8_ = sVar4;
      auVar30._12_4_ = 0x45300000;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_550,
                           (size_type)real_budget);
      *pvVar11 = ((auVar30._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) * 0.01;
    }
    else {
      dVar13 = Arg._budpercent * 10.0;
      pvVar5 = std::
               vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                             *)local_230,(size_type)real_budget);
      sVar4 = std::
              vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              ::size(pvVar5);
      auVar31._8_4_ = (int)(sVar4 >> 0x20);
      auVar31._0_8_ = sVar4;
      auVar31._12_4_ = 0x45300000;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_550,
                           (size_type)real_budget);
      *pvVar11 = dVar13 * ((auVar31._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
    }
  }
  sVar4 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  *)local_230);
  auVar34._8_4_ = (int)(sVar4 >> 0x20);
  auVar34._0_8_ = sVar4;
  auVar34._12_4_ = 0x45300000;
  dVar13 = Arg._percent *
           (double)(int)(dVar13 * ((auVar34._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)));
  poVar3 = std::operator<<((ostream *)&std::cout,"0.3 percent degree: ");
  sVar4 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  *)local_230);
  auVar15._8_4_ = (int)(sVar4 >> 0x20);
  auVar15._0_8_ = sVar4;
  auVar15._12_4_ = 0x45300000;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e0,
                      (long)(int)(((auVar15._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) *
                                 0.3));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"0.5 percent degree: ");
  sVar4 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  *)local_230);
  auVar16._8_4_ = (int)(sVar4 >> 0x20);
  auVar16._0_8_ = sVar4;
  auVar16._12_4_ = 0x45300000;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e0,
                      (long)(int)(((auVar16._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) *
                                 0.5));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"0.7 percent degree: ");
  sVar4 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  *)local_230);
  auVar17._8_4_ = (int)(sVar4 >> 0x20);
  auVar17._0_8_ = sVar4;
  auVar17._12_4_ = 0x45300000;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e0,
                      (long)(int)(((auVar17._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) *
                                 0.7));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"0.9 percent degree: ");
  sVar4 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  *)local_230);
  auVar18._8_4_ = (int)(sVar4 >> 0x20);
  auVar18._0_8_ = sVar4;
  auVar18._12_4_ = 0x45300000;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e0,
                      (long)(int)(((auVar18._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) *
                                 0.9));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"0.95 percent degree: ");
  sVar4 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  *)local_230);
  auVar19._8_4_ = (int)(sVar4 >> 0x20);
  auVar19._0_8_ = sVar4;
  auVar19._12_4_ = 0x45300000;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e0,
                      (long)(int)(((auVar19._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) *
                                 0.95));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"0.99 percent degree: ");
  sVar4 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  *)local_230);
  auVar20._8_4_ = (int)(sVar4 >> 0x20);
  auVar20._0_8_ = sVar4;
  auVar20._12_4_ = 0x45300000;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e0,
                      (long)(int)(((auVar20._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) *
                                 0.99));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"0.999 percent degree: ");
  sVar4 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  *)local_230);
  auVar21._8_4_ = (int)(sVar4 >> 0x20);
  auVar21._0_8_ = sVar4;
  auVar21._12_4_ = 0x45300000;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e0,
                      (long)(int)(((auVar21._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) *
                                 0.999));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"0.9999 percent degree: ");
  sVar4 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  *)local_230);
  auVar22._8_4_ = (int)(sVar4 >> 0x20);
  auVar22._0_8_ = sVar4;
  auVar22._12_4_ = 0x45300000;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e0,
                      (long)(int)(((auVar22._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) *
                                 0.9999));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"0.99995 percent degree: ");
  sVar4 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  *)local_230);
  auVar23._8_4_ = (int)(sVar4 >> 0x20);
  auVar23._0_8_ = sVar4;
  auVar23._12_4_ = 0x45300000;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e0,
                      (long)(int)(((auVar23._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) *
                                 0.99995));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"0.99999 percent degree: ");
  sVar4 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  *)local_230);
  auVar24._8_4_ = (int)(sVar4 >> 0x20);
  auVar24._0_8_ = sVar4;
  auVar24._12_4_ = 0x45300000;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e0,
                      (long)(int)(((auVar24._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) *
                                 0.99999));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"0.999999 percent degree: ");
  sVar4 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  *)local_230);
  auVar25._8_4_ = (int)(sVar4 >> 0x20);
  auVar25._0_8_ = sVar4;
  auVar25._12_4_ = 0x45300000;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e0,
                      (long)(int)(((auVar25._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) *
                                 0.999999));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"0.9999999 percent degree: ");
  sVar4 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  *)local_230);
  auVar26._8_4_ = (int)(sVar4 >> 0x20);
  auVar26._0_8_ = sVar4;
  auVar26._12_4_ = 0x45300000;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e0,
                      (long)(int)(((auVar26._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) *
                                 0.9999999));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"0.99999999 percent degree: ");
  sVar4 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  *)local_230);
  auVar27._8_4_ = (int)(sVar4 >> 0x20);
  auVar27._0_8_ = sVar4;
  auVar27._12_4_ = 0x45300000;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e0,
                      (long)(int)(((auVar27._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) *
                                 0.99999999));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"# nodes: ");
  sVar4 = std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                  *)local_230);
  auVar32._8_4_ = (int)(sVar4 >> 0x20);
  auVar32._0_8_ = sVar4;
  auVar32._12_4_ = 0x45300000;
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(int)(Arg._delta *
                                  ((auVar32._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0))));
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"real budget: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar13);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&Arg._resultFolder.field_2 + 8),"CELF");
  if ((((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&Arg._resultFolder.field_2 + 8),"celf"), bVar1)) ||
      (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&Arg._resultFolder.field_2 + 8),"CELF++"), bVar1)) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&Arg._resultFolder.field_2 + 8),"celf++"), bVar1)) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&Arg._resultFolder.field_2 + 8),"CELF");
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&Arg._resultFolder.field_2 + 8),"celf"), bVar1)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"start CELF algorithm");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      Timer::Timer((Timer *)&res.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      CELF::celfalgo((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3,
                     (Graph *)local_230,(double)Arg._16_8_,
                     (vector<double,_std::allocator<double>_> *)local_550,Arg._normalpha._0_4_);
      poVar3 = std::operator<<((ostream *)&std::cout,"Time used (sec): ");
      dVar13 = Timer::get_total_time
                         ((Timer *)&res.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar13);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      __end3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3);
      iStack_5d0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3);
      while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffa30), bVar1) {
        puVar12 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(&__end3);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)*puVar12);
        std::operator<<(poVar3," ");
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&__end3);
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"Seed Size: ");
      sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&Arg._resultFolder.field_2 + 8),"CELF++");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&Arg._resultFolder.field_2 + 8),"celf++"), bVar1)) {
        poVar3 = std::operator<<((ostream *)&std::cout,"start CELF++ algorithm");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        Timer::Timer((Timer *)&res_1.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        CELFPP::celfppalgo((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4,
                           (Graph *)local_230,(double)Arg._16_8_,
                           (vector<double,_std::allocator<double>_> *)local_550,Arg._normalpha._0_4_
                          );
        poVar3 = std::operator<<((ostream *)&std::cout,"Time used (sec): ");
        dVar13 = Timer::get_total_time
                           ((Timer *)&res_1.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar13);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        __end4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4);
        iStack_628 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4);
        while (bVar1 = __gnu_cxx::operator!=(&__end4,&stack0xfffffffffffff9d8), bVar1) {
          puVar12 = __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&__end4);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)*puVar12);
          std::operator<<(poVar3," ");
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&__end4);
        }
        std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cout,"Seed Size: ");
        sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4);
      }
    }
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&Arg._resultFolder.field_2 + 8),"opim-c");
    if (((((((bVar1) ||
            (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&Arg._resultFolder.field_2 + 8),"OPIM-C"), bVar1)) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&Arg._resultFolder.field_2 + 8),"opim"), bVar1)) ||
          ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&Arg._resultFolder.field_2 + 8),"OPIM"), bVar1 ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&Arg._resultFolder.field_2 + 8),"opim-b"), bVar1))))
         || ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&Arg._resultFolder.field_2 + 8),"OPIM-B"), bVar1 ||
             ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)&Arg._resultFolder.field_2 + 8),"opim-b-n"), bVar1
              || (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&Arg._resultFolder.field_2 + 8),"OPIM-B-N"),
                 bVar1)))))) ||
        ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&Arg._resultFolder.field_2 + 8),"opim-b-fe"), bVar1 ||
         ((((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&Arg._resultFolder.field_2 + 8),"OPIM-B-FE"), bVar1
            || (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&Arg._resultFolder.field_2 + 8),"opim-ba"), bVar1)
            ) || (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&Arg._resultFolder.field_2 + 8),"OPIM-BA"),
                 bVar1)) ||
          (((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&Arg._resultFolder.field_2 + 8),"opim-b-fa"), bVar1
            || (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&Arg._resultFolder.field_2 + 8),"OPIM-B-FA"),
               bVar1)) ||
           ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&Arg._resultFolder.field_2 + 8),"opim-a"), bVar1 ||
            ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&Arg._resultFolder.field_2 + 8),"OPIM-A"), bVar1 ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&Arg._resultFolder.field_2 + 8),"opim-a-f"), bVar1))
            )))))))))) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&Arg._resultFolder.field_2 + 8),"OPIM-A-F"), bVar1)) {
      if (Arg._normalpha._0_4_ == LT) {
        to_normal_accum_prob((Graph *)local_288);
      }
      ResultInfo::ResultInfo
                ((ResultInfo *)
                 &tAlg.__vecSeed_inf_cost.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      Alg::Alg((Alg *)local_888,(Graph *)local_288,
               (TResult *)
               &tAlg.__vecSeed_inf_cost.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
      Alg::set_cascade_model((Alg *)local_888,Arg._normalpha._0_4_);
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "  ==>Graph loaded for RIS! total time used (sec): ");
      dVar9 = Timer::get_total_time
                        ((Timer *)&graph.
                                   super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar9);
      std::operator<<(poVar3,'\n');
      delta._4_4_ = 2;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&Arg._graphname.field_2 + 8),"0");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&Arg._graphname.field_2 + 8),"vanilla"), bVar1)) {
        delta._4_4_ = 0;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&Arg._graphname.field_2 + 8),"1");
        if ((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&Arg._graphname.field_2 + 8),"last"), bVar1)) {
          delta._4_4_ = 1;
        }
      }
      local_898 = Arg._feps;
      if (Arg._feps < 0.0) {
        sVar4 = std::
                vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                ::size((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                        *)local_288);
        auVar33._8_4_ = (int)(sVar4 >> 0x20);
        auVar33._0_8_ = sVar4;
        auVar33._12_4_ = 0x45300000;
        local_898 = 1.0 / ((auVar33._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&Arg._resultFolder.field_2 + 8),"opim-c");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&Arg._resultFolder.field_2 + 8),"OPIM-C"), bVar1)) {
        Alg::opimc((Alg *)local_888,infilename.field_2._12_4_,Arg._budget,local_898,delta._4_4_);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&Arg._resultFolder.field_2 + 8),"opim");
        if ((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&Arg._resultFolder.field_2 + 8),"OPIM"), bVar1)) {
          Alg::opim((Alg *)local_888,infilename.field_2._12_4_,Arg._0_8_,local_898,delta._4_4_);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&Arg._resultFolder.field_2 + 8),"opim-b");
          if ((bVar1) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&Arg._resultFolder.field_2 + 8),"OPIM-B"), bVar1)) {
            poVar3 = std::operator<<((ostream *)&std::cout,"OPIM-B");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            Alg::opimb((Alg *)local_888,(Graph *)local_230,dVar13,
                       (vector<double,_std::allocator<double>_> *)local_550,Arg._budget,local_898,
                       delta._4_4_);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&Arg._resultFolder.field_2 + 8),"opim-b-n");
            if ((bVar1) ||
               (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&Arg._resultFolder.field_2 + 8),"OPIM-B-N"), bVar1
               )) {
              poVar3 = std::operator<<((ostream *)&std::cout,"OPIM-B-NAIVE");
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              Alg::opimb_naive((Alg *)local_888,(Graph *)local_230,dVar13,
                               (vector<double,_std::allocator<double>_> *)local_550,Arg._budget,
                               local_898,0);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&Arg._resultFolder.field_2 + 8),"opim-b-fe");
              if ((bVar1) ||
                 (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&Arg._resultFolder.field_2 + 8),"OPIM-B-FE"),
                 bVar1)) {
                poVar3 = std::operator<<((ostream *)&std::cout,"OPIM-B-FAST-END");
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                if ((Arg._normalpha._0_4_ == LT) &&
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&Arg._model,"twitter"), dVar9 = local_898, bVar1)) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_8b8,"LT",&local_8b9);
                  std::__cxx11::string::string((string *)&local_8e0,(string *)&Arg._model);
                  Alg::opimb_fast_end((Alg *)local_888,(Graph *)local_230,dVar13,
                                      (vector<double,_std::allocator<double>_> *)local_550,
                                      Arg._budget,Arg._eps,dVar9,&local_8b8,&local_8e0,1);
                  std::__cxx11::string::~string((string *)&local_8e0);
                  std::__cxx11::string::~string((string *)&local_8b8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_8b9);
                }
                else {
                  dVar9 = local_898;
                  if (Arg._normalpha._0_4_ == LT) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_900,"LT",&local_901);
                    std::__cxx11::string::string((string *)&local_928,(string *)&Arg._model);
                    Alg::opimb_fast_end((Alg *)local_888,(Graph *)local_230,dVar13,
                                        (vector<double,_std::allocator<double>_> *)local_550,
                                        Arg._budget,Arg._eps,dVar9,&local_900,&local_928,delta._4_4_
                                       );
                    std::__cxx11::string::~string((string *)&local_928);
                    std::__cxx11::string::~string((string *)&local_900);
                    std::allocator<char>::~allocator((allocator<char> *)&local_901);
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_948,"IC",&local_949);
                    std::__cxx11::string::string((string *)&local_970,(string *)&Arg._model);
                    Alg::opimb_fast_end((Alg *)local_888,(Graph *)local_230,dVar13,
                                        (vector<double,_std::allocator<double>_> *)local_550,
                                        Arg._budget,Arg._eps,dVar9,&local_948,&local_970,delta._4_4_
                                       );
                    std::__cxx11::string::~string((string *)&local_970);
                    std::__cxx11::string::~string((string *)&local_948);
                    std::allocator<char>::~allocator((allocator<char> *)&local_949);
                  }
                }
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&Arg._resultFolder.field_2 + 8),"opim-ba");
                if ((bVar1) ||
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)&Arg._resultFolder.field_2 + 8),"OPIM-BA"),
                   bVar1)) {
                  poVar3 = std::operator<<((ostream *)&std::cout,"OPIM-B-APPROX");
                  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                  Alg::opimb_approx((Alg *)local_888,(Graph *)local_230,dVar13,
                                    (vector<double,_std::allocator<double>_> *)local_550,Arg._budget
                                    ,local_898,delta._4_4_);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&Arg._resultFolder.field_2 + 8),"opim-b-fa");
                  if ((bVar1) ||
                     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)&Arg._resultFolder.field_2 + 8),"OPIM-B-FA")
                     , bVar1)) {
                    poVar3 = std::operator<<((ostream *)&std::cout,"OPIM-B-FAST-APPROX");
                    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                    Alg::opimb_fast_approx
                              ((Alg *)local_888,(Graph *)local_230,dVar13,
                               (vector<double,_std::allocator<double>_> *)local_550,Arg._budget,
                               Arg._eps,local_898,delta._4_4_);
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)&Arg._resultFolder.field_2 + 8),"opim-a");
                    if ((bVar1) ||
                       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)((long)&Arg._resultFolder.field_2 + 8),"OPIM-A"),
                       bVar1)) {
                      poVar3 = std::operator<<((ostream *)&std::cout,"OPIM-APPROX");
                      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                      dVar9 = local_898;
                      if (Arg._normalpha._0_4_ == LT) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string((string *)&local_990,"LT",&local_991);
                        std::__cxx11::string::string((string *)&local_9b8,(string *)&Arg._model);
                        Alg::opim_approx((Alg *)local_888,(Graph *)local_230,dVar13,
                                         (vector<double,_std::allocator<double>_> *)local_550,
                                         Arg._budget,Arg._eps,dVar9,&local_990,&local_9b8,
                                         delta._4_4_);
                        std::__cxx11::string::~string((string *)&local_9b8);
                        std::__cxx11::string::~string((string *)&local_990);
                        std::allocator<char>::~allocator((allocator<char> *)&local_991);
                      }
                      else {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string((string *)&local_9d8,"IC",&local_9d9);
                        std::__cxx11::string::string((string *)&local_a00,(string *)&Arg._model);
                        Alg::opim_approx((Alg *)local_888,(Graph *)local_230,dVar13,
                                         (vector<double,_std::allocator<double>_> *)local_550,
                                         Arg._budget,Arg._eps,dVar9,&local_9d8,&local_a00,
                                         delta._4_4_);
                        std::__cxx11::string::~string((string *)&local_a00);
                        std::__cxx11::string::~string((string *)&local_9d8);
                        std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
                      }
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)&Arg._resultFolder.field_2 + 8),"opim-a-f");
                      if ((bVar1) ||
                         (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&Arg._resultFolder.field_2 + 8),
                                                  "OPIM-A-F"), bVar1)) {
                        poVar3 = std::operator<<((ostream *)&std::cout,"OPIM-APPROX-FAST");
                        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                        dVar9 = local_898;
                        if (Arg._normalpha._0_4_ == LT) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string((string *)&local_a20,"LT",&local_a21);
                          std::__cxx11::string::string((string *)&local_a48,(string *)&Arg._model);
                          Alg::opim_approx_fast
                                    ((Alg *)local_888,(Graph *)local_230,dVar13,
                                     (vector<double,_std::allocator<double>_> *)local_550,
                                     Arg._budget,Arg._eps,dVar9,&local_a20,&local_a48,delta._4_4_);
                          std::__cxx11::string::~string((string *)&local_a48);
                          std::__cxx11::string::~string((string *)&local_a20);
                          std::allocator<char>::~allocator((allocator<char> *)&local_a21);
                        }
                        else {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string((string *)&local_a68,"IC",&local_a69);
                          std::__cxx11::string::string((string *)&local_a90,(string *)&Arg._model);
                          Alg::opim_approx_fast
                                    ((Alg *)local_888,(Graph *)local_230,dVar13,
                                     (vector<double,_std::allocator<double>_> *)local_550,
                                     Arg._budget,Arg._eps,dVar9,&local_a68,&local_a90,delta._4_4_);
                          std::__cxx11::string::~string((string *)&local_a90);
                          std::__cxx11::string::~string((string *)&local_a68);
                          std::allocator<char>::~allocator((allocator<char> *)&local_a69);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      IOcontroller::write_result
                ((string *)((long)&Arg._probDist.field_2 + 8),
                 (TResult *)
                 &tAlg.__vecSeed_inf_cost.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(string *)((long)&Arg._dir.field_2 + 8))
      ;
      IOcontroller::write_order_seeds
                ((string *)((long)&Arg._probDist.field_2 + 8),
                 (TResult *)
                 &tAlg.__vecSeed_inf_cost.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(string *)((long)&Arg._dir.field_2 + 8),
                 (Graph *)local_230);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&Arg._resultFolder.field_2 + 8),"opim-b");
      if ((((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&Arg._resultFolder.field_2 + 8),"OPIM-B"), bVar1)) ||
          (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&Arg._resultFolder.field_2 + 8),"opim-b-n"), bVar1)) ||
         (((((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&Arg._resultFolder.field_2 + 8),"OPIM-B-N"), bVar1
             || (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)((long)&Arg._resultFolder.field_2 + 8),"opim-b-fe"),
                bVar1)) ||
            ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&Arg._resultFolder.field_2 + 8),"OPIM-B-FE"), bVar1
             || ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&Arg._resultFolder.field_2 + 8),"opim-ba"),
                 bVar1 || (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&Arg._resultFolder.field_2 + 8),"OPIM-BA"
                                                  ), bVar1)))))) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&Arg._resultFolder.field_2 + 8),"opim-b-fa"), bVar1))
          || ((((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)((long)&Arg._resultFolder.field_2 + 8),"OPIM-B-FA"),
                bVar1 || (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&Arg._resultFolder.field_2 + 8),"opim-a")
                         , bVar1)) ||
               (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&Arg._resultFolder.field_2 + 8),"OPIM-A"), bVar1))
              || ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)((long)&Arg._resultFolder.field_2 + 8),"opim-a-f"),
                  bVar1 || (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&Arg._resultFolder.field_2 + 8),
                                                  "OPIM-A-F"), bVar1)))))))) {
        IOcontroller::write_budget_order_seeds
                  ((string *)((long)&Arg._probDist.field_2 + 8),
                   (TResult *)
                   &tAlg.__vecSeed_inf_cost.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (string *)((long)&Arg._dir.field_2 + 8),(Graph *)local_230);
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"---The End of ");
      poVar3 = std::operator<<(poVar3,(string *)(Arg._probDist.field_2._M_local_buf + 8));
      std::operator<<(poVar3,"---\n");
      Alg::~Alg((Alg *)local_888);
      ResultInfo::~ResultInfo
                ((ResultInfo *)
                 &tAlg.__vecSeed_inf_cost.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
  }
  argv_local._4_4_ = 0;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_550);
  std::ofstream::~ofstream(local_4f0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2e0);
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             *)local_288);
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             *)local_230);
LAB_0011b16b:
  std::__cxx11::string::~string((string *)local_180);
  Argument::~Argument((Argument *)((long)&infilename.field_2 + 8));
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
    // Randomize the seed for generating random numbers
    dsfmt_gv_init_gen_rand(static_cast<uint32_t>(time(nullptr)));
    const TArgument Arg(argc, argv);
    const string infilename = Arg._dir + "/" + Arg._graphname;
    if (Arg._func == 0 || Arg._func == 2) {
        // Format the graph
        GraphBase::format_graph(infilename, Arg._mode);
        if (Arg._func == 0) {
            return 1;
        }
    }

    cout << "---The Begin of " << Arg._outFileName << "---\n";
    Timer mainTimer("main");
    cout << "Format Graph Successfully" << endl;

    // Load the reverse graph
    Graph graph = GraphBase::load_graph(infilename, false, Arg._probDist, Arg._probEdge);
    Graph resgraph = GraphBase::load_graph(infilename, true, Arg._probDist, Arg._probEdge);
    cout << "Load Graph Successfully" << endl;

    vector<size_t> vec_degree(graph.size(), 0);
    std::ofstream outputFile("degree_" + Arg._graphname);
    size_t count_degree = 0;
    for (size_t i = 0; i < graph.size(); i++) {
        vec_degree[i] = graph[i].size();
        count_degree = count_degree + graph[i].size();
    }
    std::cout << "# Node: " << graph.size() << std::endl;
    std::cout << "# Edge: " << count_degree << std::endl;
    std::cout << "Ave degree: " << (double) count_degree / graph.size() << std::endl;
    outputFile.close();
    sort(vec_degree.begin(), vec_degree.end(), [](auto & left, auto & right){
        return left < right;
    });

    // Assign budget for each node
    vector<double> budget_list(graph.size(), 0);
    default_random_engine engine;
    uniform_int_distribution<unsigned> u(5, 10);
    for (size_t i = 0; i < graph.size(); i++) {
        if (graph[i].size() > vec_degree[int(Arg._percent * graph.size())]) {
            budget_list[i] = (double) 10 * 0.001 * graph[i].size();
//            budget_list[i] = (double) u(engine) * 0.001 * graph[i].size();
        }
        else {
            budget_list[i] = (double) 10 * Arg._normalpha * graph[i].size();
//            budget_list[i] = (double) u(engine) * Arg._normalpha * graph[i].size();
        }
    }
    double real_budget = (double) Arg._budpercent * int(Arg._percent * graph.size());
//    double real_budget = (double) Arg._budpercent * int(graph.size());
    std::cout << "0.3 percent degree: " << vec_degree[int(0.3 * graph.size())] << std::endl;
    std::cout << "0.5 percent degree: " << vec_degree[int(0.5 * graph.size())] << std::endl;
    std::cout << "0.7 percent degree: " << vec_degree[int(0.7 * graph.size())] << std::endl;
    std::cout << "0.9 percent degree: " << vec_degree[int(0.9 * graph.size())] << std::endl;
    std::cout << "0.95 percent degree: " << vec_degree[int(0.95 * graph.size())] << std::endl;
    std::cout << "0.99 percent degree: " << vec_degree[int(0.99 * graph.size())] << std::endl;
    std::cout << "0.999 percent degree: " << vec_degree[int(0.999 * graph.size())] << std::endl;
    std::cout << "0.9999 percent degree: " << vec_degree[int(0.9999 * graph.size())] << std::endl;
    std::cout << "0.99995 percent degree: " << vec_degree[int(0.99995 * graph.size())] << std::endl;
    std::cout << "0.99999 percent degree: " << vec_degree[int(0.99999 * graph.size())] << std::endl;
    std::cout << "0.999999 percent degree: " << vec_degree[int(0.999999 * graph.size())] << std::endl;
    std::cout << "0.9999999 percent degree: " << vec_degree[int(0.9999999 * graph.size())] << std::endl;
    std::cout << "0.99999999 percent degree: " << vec_degree[int(0.99999999 * graph.size())] << std::endl;
    std::cout << "# nodes: " << int(Arg._percent * graph.size()) << std::endl;
    std::cout << "real budget: " << real_budget << std::endl;

    if (Arg._algName == "CELF" || Arg._algName == "celf" ||
        Arg._algName == "CELF++" || Arg._algName == "celf++") {
        if (Arg._algName == "CELF" || Arg._algName == "celf") {
            cout << "start CELF algorithm" << endl;
            Timer EvalTimer;
            vector<size_t> res = CELF::celfalgo(graph, Arg._budget, budget_list, Arg._model);
            cout << "Time used (sec): " << EvalTimer.get_total_time() << endl;
            for(unsigned int re : res) {
                cout << re << " ";
            }
            cout << endl;
            cout << "Seed Size: " << res.size() << endl;
        }
        else if (Arg._algName == "CELF++" || Arg._algName == "celf++") {
            cout << "start CELF++ algorithm" << endl;
            Timer EvalTimer;
            vector<size_t> res = CELFPP::celfppalgo(graph, Arg._budget, budget_list, Arg._model);
            cout << "Time used (sec): " << EvalTimer.get_total_time() << endl;
            for(unsigned int re : res) {
                cout << re << " ";
            }
            cout << endl;
            cout << "Seed Size: " << res.size() << endl;
        }
    }
    // IMAGE == opim-b-fe IMAGE-BR = opim-b
    else if (Arg._algName == "opim-c" || Arg._algName == "OPIM-C" ||
             Arg._algName == "opim" || Arg._algName == "OPIM" ||
             Arg._algName == "opim-b" || Arg._algName == "OPIM-B" ||
             Arg._algName == "opim-b-n" || Arg._algName == "OPIM-B-N" ||
             Arg._algName == "opim-b-fe" || Arg._algName == "OPIM-B-FE" ||
             Arg._algName == "opim-ba" || Arg._algName == "OPIM-BA" ||
             Arg._algName == "opim-b-fa" || Arg._algName == "OPIM-B-FA" ||
             Arg._algName == "opim-a" || Arg._algName == "OPIM-A" ||
             Arg._algName == "opim-a-f" || Arg._algName == "OPIM-A-F") {
        if (Arg._model == LT) {
            // Normalize the propagation probabilities in accumulation format for
            // LT cascade model for quickly generating RR sets
            to_normal_accum_prob(resgraph);
        }
        // Initialize a result object to record the results
        TResult tRes;
        TAlg tAlg(resgraph, tRes);
        tAlg.set_cascade_model(Arg._model); // Set propagation model

        cout << "  ==>Graph loaded for RIS! total time used (sec): " << mainTimer.get_total_time() << '\n';
        int mode = 2; // Default is to use the minimum upper bound among all the rounds
        if (Arg._mode == "0" || Arg._mode == "vanilla") {
            mode = 0;
        }
        else if (Arg._mode == "1" || Arg._mode == "last") {
            mode = 1;
        }
        auto delta = Arg._delta;
        if (delta < 0) {
            delta = 1.0 / resgraph.size();
        }
        if (Arg._algName == "opim-c" || Arg._algName == "OPIM-C") {
            tAlg.opimc(Arg._seedsize, Arg._eps, delta, mode);
        }
        else if (Arg._algName == "opim" || Arg._algName == "OPIM") {
            tAlg.opim(Arg._seedsize, Arg._samplesize, delta, mode);
        }
        else if (Arg._algName == "opim-b" || Arg._algName == "OPIM-B") {
            cout << "OPIM-B" << endl;
            tAlg.opimb(graph, real_budget, budget_list, Arg._eps, delta, mode);
        }
        else if (Arg._algName == "opim-b-n" || Arg._algName == "OPIM-B-N") {
            cout << "OPIM-B-NAIVE" << endl;
            tAlg.opimb_naive(graph, real_budget, budget_list, Arg._eps, delta, 0);
        }
        else if (Arg._algName == "opim-b-fe" || Arg._algName == "OPIM-B-FE") {
            cout << "OPIM-B-FAST-END" << endl;
            if (Arg._model == LT && Arg._graphname == "twitter") {
                tAlg.opimb_fast_end(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "LT",
                        Arg._graphname, 1);
            }
            else {
                if (Arg._model == LT) {
                    tAlg.opimb_fast_end(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "LT",
                            Arg._graphname, mode);
                }
                else {
                    tAlg.opimb_fast_end(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "IC",
                            Arg._graphname, mode);
                }
            }
        }
        else if (Arg._algName == "opim-ba" || Arg._algName == "OPIM-BA") {
            cout << "OPIM-B-APPROX" << endl;
            tAlg.opimb_approx(graph, real_budget, budget_list, Arg._eps, delta, mode);
        }
        else if (Arg._algName == "opim-b-fa" || Arg._algName == "OPIM-B-FA") {
            cout << "OPIM-B-FAST-APPROX" << endl;
            tAlg.opimb_fast_approx(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, mode);
        }
        else if (Arg._algName == "opim-a" || Arg._algName == "OPIM-A") {
            cout << "OPIM-APPROX" << endl;
            if (Arg._model == LT) {
                tAlg.opim_approx(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "LT",
                                 Arg._graphname, mode);
            }
            else {
                tAlg.opim_approx(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "IC",
                                 Arg._graphname, mode);
            }

        }
        else if (Arg._algName == "opim-a-f" || Arg._algName == "OPIM-A-F") {
            cout << "OPIM-APPROX-FAST" << endl;
            if (Arg._model == LT) {
                tAlg.opim_approx_fast(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "LT",
                        Arg._graphname, mode);
            }
            else {
                tAlg.opim_approx_fast(graph, real_budget, budget_list, Arg._eps, Arg._feps, delta, "IC",
                        Arg._graphname, mode);
            }
        }
        TIO::write_result(Arg._outFileName, tRes, Arg._resultFolder);
        TIO::write_order_seeds(Arg._outFileName, tRes, Arg._resultFolder, graph);
        if (Arg._algName == "opim-b" || Arg._algName == "OPIM-B" ||
            Arg._algName == "opim-b-n" || Arg._algName == "OPIM-B-N" ||
            Arg._algName == "opim-b-fe" || Arg._algName == "OPIM-B-FE" ||
            Arg._algName == "opim-ba" || Arg._algName == "OPIM-BA" ||
            Arg._algName == "opim-b-fa" || Arg._algName == "OPIM-B-FA" ||
            Arg._algName == "opim-a" || Arg._algName == "OPIM-A" ||
            Arg._algName == "opim-a-f" || Arg._algName == "OPIM-A-F") {
            TIO::write_budget_order_seeds(Arg._outFileName, tRes, Arg._resultFolder, graph);
        }
        cout << "---The End of " << Arg._outFileName << "---\n";
    }

    return 0;
}